

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HwlocCpuInfo.cpp
# Opt level: O0

void xmrig::findCache<xmrig::HwlocCpuInfo::threads(unsigned_int)const::__0>
               (hwloc_obj_t obj,uint min,uint max,anon_class_8_1_4f99326f lambda)

{
  uint uVar1;
  bool bVar2;
  anon_class_8_1_4f99326f *in_RCX;
  uint in_EDX;
  uint in_ESI;
  anon_class_8_1_4f99326f in_RDI;
  uint depth;
  size_t i;
  hwloc_obj_t in_stack_ffffffffffffffc8;
  anon_class_8_1_4f99326f *in_stack_ffffffffffffffd0;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if (*(uint *)&in_RDI.caches[4].super__Vector_base<hwloc_obj_*,_std::allocator<hwloc_obj_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish <= uVar3) {
      return;
    }
    bVar2 = isCacheObject((hwloc_obj_t)0x243dec);
    if (bVar2) {
      uVar1 = (in_RDI.caches[4].super__Vector_base<hwloc_obj_*,_std::allocator<hwloc_obj_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage[uVar3]->attr->numanode).
              page_types_len;
      if ((in_ESI <= uVar1) && (uVar1 <= in_EDX)) {
        HwlocCpuInfo::threads::anon_class_8_1_4f99326f::operator()
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        goto LAB_00243e41;
      }
    }
    else {
LAB_00243e41:
      in_stack_ffffffffffffffd0 = in_RCX;
      findCache<xmrig::HwlocCpuInfo::threads(unsigned_int)const::__0>
                ((hwloc_obj_t)CONCAT44(in_ESI,in_EDX),(uint)(uVar3 >> 0x20),(uint)uVar3,in_RDI);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static inline void findCache(hwloc_obj_t obj, unsigned min, unsigned max, func lambda)
{
    for (size_t i = 0; i < obj->arity; i++) {
        if (isCacheObject(obj->children[i])) {
            const unsigned depth = obj->children[i]->attr->cache.depth;
            if (depth < min || depth > max) {
                continue;
            }

            lambda(obj->children[i]);
        }

        findCache(obj->children[i], min, max, lambda);
    }
}